

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

wstring * __thiscall
mjs::number_to_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double m)

{
  uint *puVar1;
  byte bVar2;
  int k;
  wchar_t *__s;
  ulong uVar3;
  double t;
  string local_348 [32];
  wstring local_328;
  byte abStack_308 [352];
  ostringstream woss;
  ulong local_1a0 [2];
  uint auStack_190 [88];
  
  if (NAN(m)) {
    __s = L"NaN";
  }
  else if ((m != 0.0) || (NAN(m))) {
    if (m < 0.0) {
      number_to_string_abi_cxx11_(&local_328,this,-m);
      std::operator+(__return_storage_ptr__,L"-",&local_328);
      std::__cxx11::wstring::~wstring((wstring *)&local_328);
      return __return_storage_ptr__;
    }
    if (m < INFINITY) {
      uVar3 = 1;
      do {
        if (uVar3 == 0x12) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                        ,0x9a,"std::wstring mjs::number_to_string(double)");
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&woss);
        *(ulong *)((long)local_1a0 + *(long *)(_woss + -0x18)) = uVar3;
        puVar1 = (uint *)((long)auStack_190 + *(long *)(_woss + -0x18));
        *puVar1 = *puVar1 & 0xfffffefb;
        std::ostream::_M_insert<double>(m);
        std::__cxx11::stringbuf::str();
        std::__cxx11::istringstream::istringstream((istringstream *)&local_328,local_348,_S_in);
        std::istream::_M_extract<double>((double *)&local_328);
        bVar2 = abStack_308[*(long *)(local_328._M_dataplus._M_p + -6)];
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_328);
        std::__cxx11::string::~string(local_348);
        if ((bVar2 & 5) == 0) {
          if ((t == m) && (!NAN(t) && !NAN(m))) {
            do_format_double_abi_cxx11_(__return_storage_ptr__,(mjs *)(uVar3 & 0xffffffff),m,k);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&woss);
            return __return_storage_ptr__;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&woss);
        uVar3 = uVar3 + 1;
      } while( true );
    }
    __s = L"Infinity";
  }
  else {
    __s = L"0";
  }
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,__s,(allocator<wchar_t> *)&local_328);
  return __return_storage_ptr__;
}

Assistant:

std::wstring number_to_string(double m) {
    // Handle special cases
    if (std::isnan(m)) {
        return L"NaN";
    }
    if (m == 0) {
        return L"0";
    }
    if (m < 0) {
        return L"-" + number_to_string(-m);
    }
    if (std::isinf(m)) {
        return L"Infinity";
    }

    assert(std::isfinite(m) && m > 0);

    // 9.8.1 ToString Applied to the Number Type    

    // Use really slow method to determine shortest representation of m
    for (int k = 1; k <= 17; ++k) {
        std::ostringstream woss;
        woss.precision(k);
        woss << std::defaultfloat << m;
        if (double t; std::istringstream{woss.str()} >> t && t == m) {
            return do_format_double(m, k);
        }
    }
    // More than 17 digits should never happen
    assert(false);
    throw std::runtime_error("Internal error");
}